

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O1

char * readpassphrase(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *__s;
  size_t sVar2;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    readpassphrase_cold_2();
    __s = (char *)0x0;
  }
  else {
    __s = fgetline((FILE *)__stream);
    if (__s == (char *)0x0) {
      iVar1 = ferror(__stream);
      if (iVar1 == 0) {
        __s = dupstr("");
      }
      else {
        readpassphrase_cold_1();
        __s = (char *)0x0;
      }
    }
    else {
      sVar2 = strcspn(__s,"\r\n");
      __s[sVar2] = '\0';
    }
    fclose(__stream);
  }
  return __s;
}

Assistant:

static char *readpassphrase(const char *filename)
{
    FILE *fp;
    char *line;

    fp = fopen(filename, "r");
    if (!fp) {
        fprintf(stderr, "puttygen: cannot open %s: %s\n",
                filename, strerror(errno));
        return NULL;
    }
    line = fgetline(fp);
    if (line)
        line[strcspn(line, "\r\n")] = '\0';
    else if (ferror(fp))
        fprintf(stderr, "puttygen: error reading from %s: %s\n",
                filename, strerror(errno));
    else        /* empty file */
        line = dupstr("");
    fclose(fp);
    return line;
}